

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_assert(char *file,wchar_t line,wchar_t value,char *condition,void *extra)

{
  undefined8 in_RCX;
  wchar_t in_EDX;
  wchar_t in_ESI;
  char *in_RDI;
  
  assertion_count(in_RDI,in_ESI);
  if (in_EDX == L'\0') {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Assertion failed: %s",in_RCX);
    failure_finish((void *)0x11b456);
  }
  return in_EDX;
}

Assistant:

int
assertion_assert(const char *file, int line, int value,
    const char *condition, void *extra)
{
	assertion_count(file, line);
	if (!value) {
		failure_start(file, line, "Assertion failed: %s", condition);
		failure_finish(extra);
	}
	return (value);
}